

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDFObjectHandle::getPageContents
          (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__return_storage_ptr__,
          QPDFObjectHandle *this)

{
  allocator<char> local_c1;
  string local_c0 [32];
  QPDFObjectHandle local_a0;
  undefined1 local_90 [8];
  string all_description;
  QPDFObjGen local_60;
  string local_58;
  undefined1 local_38 [8];
  string description;
  QPDFObjectHandle *this_local;
  
  description.field_2._8_8_ = this;
  local_60 = getObjGen(this);
  QPDFObjGen::unparse_abi_cxx11_(&local_58,&local_60,' ');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 "page object ",&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"/Contents",&local_c1);
  getKey(&local_a0,(string *)this);
  arrayOrStreamToStreamArray(__return_storage_ptr__,&local_a0,(string *)local_38,(string *)local_90)
  ;
  ~QPDFObjectHandle(&local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDFObjectHandle::getPageContents()
{
    std::string description = "page object " + getObjGen().unparse(' ');
    std::string all_description;
    return this->getKey("/Contents").arrayOrStreamToStreamArray(description, all_description);
}